

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O2

uint16_t gravity_function_cpool_add(gravity_vm *vm,gravity_function_t *f,gravity_value_t v)

{
  _Bool _Var1;
  void *pvVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  gravity_value_t v2;
  
  if (f->tag != EXEC_TYPE_NATIVE) {
    __assert_fail("f->tag == EXEC_TYPE_NATIVE",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/shared/gravity_value.c"
                  ,0x20e,
                  "uint16_t gravity_function_cpool_add(gravity_vm *, gravity_function_t *, gravity_value_t)"
                 );
  }
  sVar3 = (f->field_9).field_0.cpool.n;
  lVar4 = 8;
  sVar5 = 0;
  do {
    if (sVar3 == sVar5) {
      if (vm != (gravity_vm *)0x0) {
        _Var1 = gravity_value_isobject(v);
        if (_Var1) {
          gravity_vm_transfer(vm,v.field_1.p);
        }
      }
      sVar3 = (f->field_9).field_0.cpool.n;
      pvVar2 = (f->field_9).field_2.special[1];
      if (sVar3 == (f->field_9).field_0.cpool.m) {
        sVar5 = 8;
        if (sVar3 != 0) {
          sVar5 = sVar3 * 2;
        }
        (f->field_9).field_0.cpool.m = sVar5;
        pvVar2 = realloc(pvVar2,sVar5 << 4);
        (f->field_9).field_2.special[1] = pvVar2;
        sVar3 = (f->field_9).field_0.cpool.n;
      }
      (f->field_9).internal = (gravity_c_internal)(sVar3 + 1);
      *(gravity_class_t **)((long)pvVar2 + sVar3 * 0x10) = v.isa;
      ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)pvVar2 + sVar3 * 0x10 + 8))->p =
           (gravity_object_t *)v.field_1;
      sVar5 = (size_t)(*(int *)&f->field_9 - 1);
LAB_00129f20:
      return (uint16_t)sVar5;
    }
    pvVar2 = (f->field_9).field_2.special[1];
    v2.field_1.n = ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)((long)pvVar2 + lVar4))->n;
    v2.isa = *(gravity_class_t **)((long)pvVar2 + lVar4 + -8);
    _Var1 = gravity_value_equals(v,v2);
    if (_Var1) {
      gravity_value_free((gravity_vm *)0x0,v);
      goto LAB_00129f20;
    }
    sVar5 = sVar5 + 1;
    lVar4 = lVar4 + 0x10;
  } while( true );
}

Assistant:

uint16_t gravity_function_cpool_add (gravity_vm *vm, gravity_function_t *f, gravity_value_t v) {
    assert(f->tag == EXEC_TYPE_NATIVE);

    size_t n = marray_size(f->cpool);
    for (size_t i=0; i<n; i++) {
        gravity_value_t v2 = marray_get(f->cpool, i);
        if (gravity_value_equals(v,v2)) {
            gravity_value_free(NULL, v);
            return (uint16_t)i;
        }
    }

    // vm is required here because I cannot know in advance if v is already in the pool or not
    // and value object v must be added to the VM only once
    if ((vm) && (gravity_value_isobject(v))) gravity_vm_transfer(vm, VALUE_AS_OBJECT(v));

    marray_push(gravity_value_t, f->cpool, v);
    return (uint16_t)marray_size(f->cpool)-1;
}